

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O3

string * __thiscall
flatbuffers::GenIncludeGuard
          (string *__return_storage_ptr__,flatbuffers *this,string *file_name,Namespace *name_space,
          string *postfix)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  ulong uVar4;
  pointer pbVar5;
  pointer pcVar6;
  size_type sVar7;
  int iVar8;
  string *psVar9;
  undefined4 extraout_var;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  long lVar13;
  string *component;
  pointer pbVar14;
  size_type sVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  string *local_38;
  
  local_40 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,this,this + (long)&file_name->_M_dataplus);
  pcVar10 = (__return_storage_ptr__->_M_dataplus)._M_p;
  uVar4 = __return_storage_ptr__->_M_string_length;
  pcVar1 = pcVar10 + uVar4;
  pcVar12 = pcVar10;
  if (0 < (long)uVar4 >> 2) {
    pcVar12 = pcVar10 + (uVar4 & 0xfffffffffffffffc);
    lVar13 = ((long)uVar4 >> 2) + 1;
    pcVar11 = pcVar10 + 3;
    do {
      if (((int)pcVar11[-3] & 0xffffffdfU) - 0x5b < 0xffffffe6 &&
          (int)pcVar11[-3] - 0x3aU < 0xfffffff6) {
        pcVar11 = pcVar11 + -3;
        goto LAB_0016024b;
      }
      if (((int)pcVar11[-2] & 0xffffffdfU) - 0x5b < 0xffffffe6 &&
          (int)pcVar11[-2] - 0x3aU < 0xfffffff6) {
        pcVar11 = pcVar11 + -2;
        goto LAB_0016024b;
      }
      if (((int)pcVar11[-1] & 0xffffffdfU) - 0x5b < 0xffffffe6 &&
          (int)pcVar11[-1] - 0x3aU < 0xfffffff6) {
        pcVar11 = pcVar11 + -1;
        goto LAB_0016024b;
      }
      if (((int)*pcVar11 & 0xffffffdfU) - 0x5b < 0xffffffe6 && (int)*pcVar11 - 0x3aU < 0xfffffff6)
      goto LAB_0016024b;
      lVar13 = lVar13 + -1;
      pcVar11 = pcVar11 + 4;
    } while (1 < lVar13);
  }
  lVar13 = (long)pcVar1 - (long)pcVar12;
  if (lVar13 == 1) {
LAB_0016021b:
    pcVar11 = pcVar12;
    if (0xfffffff5 < (int)*pcVar12 - 0x3aU) {
      pcVar11 = pcVar1;
    }
    if (0xffffffe5 < ((int)*pcVar12 & 0xffffffdfU) - 0x5b) {
      pcVar11 = pcVar1;
    }
  }
  else if (lVar13 == 2) {
LAB_001601f8:
    pcVar11 = pcVar12;
    if (0xffffffe5 < ((int)*pcVar12 & 0xffffffdfU) - 0x5b || 0xfffffff5 < (int)*pcVar12 - 0x3aU) {
      pcVar12 = pcVar12 + 1;
      goto LAB_0016021b;
    }
  }
  else {
    pcVar11 = pcVar1;
    if (lVar13 != 3) goto LAB_0016029e;
    pcVar11 = pcVar12;
    if (0xffffffe5 < ((int)*pcVar12 & 0xffffffdfU) - 0x5b || 0xfffffff5 < (int)*pcVar12 - 0x3aU) {
      pcVar12 = pcVar12 + 1;
      goto LAB_001601f8;
    }
  }
LAB_0016024b:
  pcVar12 = pcVar11 + 1;
  if (pcVar12 != pcVar1 && pcVar11 != pcVar1) {
    do {
      cVar3 = *pcVar12;
      if (0xffffffe5 < ((int)cVar3 & 0xffffffdfU) - 0x5b || 0xfffffff5 < (int)cVar3 - 0x3aU) {
        *pcVar11 = cVar3;
        pcVar11 = pcVar11 + 1;
      }
      pcVar12 = pcVar12 + 1;
    } while (pcVar12 != pcVar1);
    pcVar10 = (__return_storage_ptr__->_M_dataplus)._M_p;
  }
LAB_0016029e:
  __return_storage_ptr__->_M_string_length = (long)pcVar11 - (long)pcVar10;
  *pcVar11 = '\0';
  std::operator+(&local_60,"FLATBUFFERS_GENERATED_",__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_60);
  paVar2 = &local_60.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  local_38 = postfix;
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  pbVar14 = (name_space->components).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (name_space->components).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar14 != pbVar5) {
    do {
      pcVar6 = (pbVar14->_M_dataplus)._M_p;
      local_60._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,pcVar6,pcVar6 + pbVar14->_M_string_length);
      std::__cxx11::string::append((char *)&local_60);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_60._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != paVar2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      pbVar14 = pbVar14 + 1;
    } while (pbVar14 != pbVar5);
  }
  if (local_38->_M_string_length != 0) {
    pcVar6 = (local_38->_M_dataplus)._M_p;
    local_60._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar6,pcVar6 + local_38->_M_string_length);
    std::__cxx11::string::append((char *)&local_60);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_60._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  psVar9 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
  sVar7 = __return_storage_ptr__->_M_string_length;
  if (sVar7 != 0) {
    pcVar6 = (__return_storage_ptr__->_M_dataplus)._M_p;
    sVar15 = 0;
    do {
      iVar8 = toupper((uint)(byte)pcVar6[sVar15]);
      psVar9 = (string *)CONCAT44(extraout_var,iVar8);
      pcVar6[sVar15] = (char)iVar8;
      sVar15 = sVar15 + 1;
    } while (sVar7 != sVar15);
  }
  return psVar9;
}

Assistant:

static std::string GenIncludeGuard(const std::string &file_name,
                                   const Namespace &name_space,
                                   const std::string &postfix = "") {
  // Generate include guard.
  std::string guard = file_name;
  // Remove any non-alpha-numeric characters that may appear in a filename.
  struct IsAlnum {
    bool operator()(char c) const { return !is_alnum(c); }
  };
  guard.erase(std::remove_if(guard.begin(), guard.end(), IsAlnum()),
              guard.end());
  guard = "FLATBUFFERS_GENERATED_" + guard;
  guard += "_";
  // For further uniqueness, also add the namespace.
  for (const std::string &component : name_space.components) {
    guard += component + "_";
  }
  // Anything extra to add to the guard?
  if (!postfix.empty()) { guard += postfix + "_"; }
  guard += "H_";
  std::transform(guard.begin(), guard.end(), guard.begin(), CharToUpper);
  return guard;
}